

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_common.h
# Opt level: O2

int __thiscall ktx::OptionsEncodeCommon::init(OptionsEncodeCommon *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  OptionAdder *pOVar2;
  allocator<char> local_202;
  allocator<char> local_201;
  allocator<char> local_200;
  allocator<char> local_1ff;
  allocator<char> local_1fe;
  allocator<char> local_1fd;
  allocator<char> local_1fc;
  allocator<char> local_1fb;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  element_type *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f0;
  element_type *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  shared_ptr<const_cxxopts::Value> local_1d8;
  element_type *local_1c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  shared_ptr<const_cxxopts::Value> local_1b8;
  shared_ptr<const_cxxopts::Value> local_1a8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [40];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Encode common",&local_1f9)
  ;
  cxxopts::Options::add_options((OptionAdder *)local_78,(Options *)ctx,&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kNormalMode,&local_1fa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "Optimizes for encoding textures with normal data. If the input texture has three or four linear components it is assumed to be a three component linear normal map storing unit length normals as (R=X, G=Y, B=Z). A fourth component will be ignored. The map will be converted to a two component X+Y normal map stored as (RGB=X, A=Y) prior to encoding. If unsure that your normals are unit length, use --normalize. If the input has 2 linear components it is assumed to be an X+Y map of unit normals.\nThe Z component can be recovered programmatically in shader code by using the equations:\n    nml.xy = texture(...).ga;              // Load in [0,1]\n    nml.xy = nml.xy * 2.0 - 1.0;           // Unpack to [-1,1]\n    nml.z = sqrt(1 - dot(nml.xy, nml.xy)); // Compute Z\nETC1S / BasisLZ encoding, RDO is disabled (no selector RDO, no endpoint RDO) to provide better quality."
             ,&local_1fb);
  cxxopts::value<bool>();
  local_1a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1f8;
  local_1a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1f0._M_pi;
  local_1f8 = (element_type *)0x0;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_1fc);
  pOVar2 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_78,&local_98,&local_b8,&local_1a8,&local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,kThreads,&local_1fd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "Sets the number of threads to use during encoding. By default, encoding will use the number of threads reported by thread::hardware_concurrency or 1 if value returned is 0."
             ,&local_1fe);
  cxxopts::value<unsigned_int>();
  local_1b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1c8;
  local_1b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1c0._M_pi;
  local_1c8 = (element_type *)0x0;
  _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"<count>",&local_1ff);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_f8,&local_118,&local_1b8,&local_138);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,kNoSse,&local_200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,
             "Forbid use of the SSE instruction set. Ignored if CPU does not support SSE. SSE can only be disabled on the basis-lz and uastc compressors."
             ,&local_201);
  cxxopts::value<bool>();
  local_1d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1e8;
  local_1d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1e0._M_pi;
  local_1e8 = (element_type *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"",&local_202);
  cxxopts::OptionAdder::operator()(pOVar2,&local_158,&local_178,&local_1d8,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1c0);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1f0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  iVar1 = std::__cxx11::string::~string((string *)&local_50);
  return iVar1;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options("Encode common")
            (kNormalMode, "Optimizes for encoding textures with normal data. If the input texture has "
                "three or four linear components it is assumed to be a three component linear normal "
                "map storing unit length normals as (R=X, G=Y, B=Z). A fourth component will be ignored. "
                "The map will be converted to a two component X+Y normal map stored as (RGB=X, A=Y) "
                "prior to encoding. If unsure that your normals are unit length, use --normalize. "
                "If the input has 2 linear components it is assumed to be an X+Y map of unit normals.\n"
                "The Z component can be recovered programmatically in shader code by using the equations:\n"
                "    nml.xy = texture(...).ga;              // Load in [0,1]\n"
                "    nml.xy = nml.xy * 2.0 - 1.0;           // Unpack to [-1,1]\n"
                "    nml.z = sqrt(1 - dot(nml.xy, nml.xy)); // Compute Z\n"
                "ETC1S / BasisLZ encoding, RDO is disabled (no selector RDO, no endpoint RDO) to provide better quality.")
            (kThreads, "Sets the number of threads to use during encoding. By default, encoding "
                "will use the number of threads reported by thread::hardware_concurrency or 1 if "
                "value returned is 0.", cxxopts::value<uint32_t>(), "<count>")
            (kNoSse, "Forbid use of the SSE instruction set. Ignored if CPU does "
               "not support SSE. SSE can only be disabled on the basis-lz and "
               "uastc compressors.");
    }